

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           *this,pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *p,
          ulong hash,arrays_type *arrays_,long *num_destroyed)

{
  locator lStack_28;
  
  *num_destroyed = *num_destroyed + 1;
  table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>,std::equal_to<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
  ::
  nosize_unchecked_emplace_at<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (&lStack_28,
             (table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>,std::equal_to<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,p);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(p->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }